

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateDependencyIncludes
          (FileGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  key_type *__k;
  bool bVar2;
  FileDescriptor *pFVar3;
  const_iterator cVar4;
  char *pcVar5;
  int index;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  string local_e8;
  string local_c8;
  Printer *local_a8;
  string local_a0;
  string local_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  public_import_names;
  
  public_import_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &public_import_names._M_t._M_impl.super__Rb_tree_header._M_header;
  public_import_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_import_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_import_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar3 = this->file_;
  local_a8 = printer;
  public_import_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       public_import_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pFVar3 + 0x38)) {
    lVar8 = 0;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,*(int *)(*(long *)(pFVar3 + 0x40) + lVar8 * 4));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&public_import_names,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar3);
      lVar8 = lVar8 + 1;
      pFVar3 = this->file_;
    } while (lVar8 < *(int *)(pFVar3 + 0x38));
  }
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x18)) {
    index = 0;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,index);
      bVar2 = IsWellKnownMessage(pFVar3);
      pFVar3 = FileDescriptor::dependency(this->file_,index);
      __k = *(key_type **)pFVar3;
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&public_import_names._M_t,__k);
      StripProto(&local_80,__k);
      p_Var1 = &public_import_names._M_t._M_impl.super__Rb_tree_header;
      pcVar6 = "  // IWYU pragma: export";
      if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
        pcVar6 = "";
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      pcVar7 = pcVar6 + 0x18;
      if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
        pcVar7 = pcVar6;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pcVar6,pcVar7);
      pcVar7 = "\"";
      pcVar6 = "\"";
      if (bVar2) {
        pcVar6 = "<";
      }
      pcVar5 = "";
      if (bVar2) {
        pcVar5 = "";
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar6,pcVar5);
      if (bVar2) {
        pcVar7 = ">";
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar6 = "";
      if (bVar2) {
        pcVar6 = "";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar7,pcVar6);
      io::Printer::Print(local_a8,"#include $left$$dependency$.pb.h$right$$iwyu$\n","dependency",
                         &local_80,"iwyu",&local_e8,"left",&local_a0,"right",&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      pFVar3 = this->file_;
    } while (index < *(int *)(pFVar3 + 0x18));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&public_import_names._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateDependencyIncludes(io::Printer* printer) {
  std::set<string> public_import_names;
  for (int i = 0; i < file_->public_dependency_count(); i++) {
    public_import_names.insert(file_->public_dependency(i)->name());
  }

  for (int i = 0; i < file_->dependency_count(); i++) {
    const bool use_system_include = IsWellKnownMessage(file_->dependency(i));
    const string& name = file_->dependency(i)->name();
    bool public_import = (public_import_names.count(name) != 0);


    printer->Print(
      "#include $left$$dependency$.pb.h$right$$iwyu$\n",
      "dependency", StripProto(name),
      "iwyu", (public_import) ? "  // IWYU pragma: export" : "",
      "left", use_system_include ? "<" : "\"",
      "right", use_system_include ? ">" : "\"");
  }
}